

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::funcFromModel
          (LLVMReadWriteGraphBuilder *this,FunctionModel *model,CallInst *CInst)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  Operand *pOVar5;
  FunctionModel *in_RDI;
  undefined1 auVar6 [16];
  Operand *uses;
  bool strong_updt;
  Operand *defines;
  Offset to;
  Offset from;
  RWNode *target;
  LLVMPointer *ptr;
  const_iterator __end3;
  const_iterator __begin3;
  LLVMPointsToSet *__range3;
  pair<bool,_dg::LLVMPointsToSet> pts;
  Value *llvmOp;
  uint i;
  RWNode *node;
  Offset in_stack_fffffffffffffe88;
  LLVMReadWriteGraphBuilder *in_stack_fffffffffffffe90;
  Offset in_stack_fffffffffffffe98;
  LLVMReadWriteGraphBuilder *in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea8;
  uint operand;
  Offset in_stack_fffffffffffffeb8;
  Offset in_stack_fffffffffffffec0;
  Offset local_d8;
  type local_d0;
  Offset local_c8;
  byte local_b9;
  pair<dg::Offset,_dg::Offset> local_a8;
  Operand *local_98;
  Offset local_90;
  Offset local_88;
  LLVMReadWriteGraphBuilder *local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  LLVMPointsToSetImpl *local_60;
  LLVMPointsToSetImpl *local_58;
  undefined1 *local_50;
  undefined4 local_44;
  byte local_40 [8];
  undefined1 auStack_38 [8];
  Value *local_30;
  uint local_24;
  Offset local_20;
  
  local_20.offset =
       (type)create(in_stack_fffffffffffffe90,(RWNodeType)(in_stack_fffffffffffffe88.offset >> 0x20)
                   );
  local_24 = 0;
  while( true ) {
    operand = local_24;
    uVar3 = llvmutils::getNumArgOperands((CallInst *)0x19ed51);
    if (uVar3 <= operand) break;
    bVar2 = FunctionModel::handles
                      ((FunctionModel *)in_stack_fffffffffffffe90,
                       (uint)(in_stack_fffffffffffffe88.offset >> 0x20));
    if (bVar2) {
      local_30 = llvm::CallBase::getArgOperand
                           ((CallBase *)in_stack_fffffffffffffe90,
                            (uint)(in_stack_fffffffffffffe88.offset >> 0x20));
      plVar1 = *(long **)&in_RDI[1]._uses._M_t._M_impl.super__Rb_tree_header._M_header;
      (**(code **)(*plVar1 + 0x10))(local_40,plVar1,local_30);
      if ((local_40[0] & 1) == 0) {
        llvm::errs();
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98.offset
                  );
        llvm::errs();
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98.offset
                  );
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffea0,
                   (string *)in_stack_fffffffffffffe98.offset);
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98.offset
                  );
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffe90,
                   (uint)(in_stack_fffffffffffffe88.offset >> 0x20));
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98.offset
                  );
        local_44 = 4;
      }
      else {
        local_50 = auStack_38;
        local_58 = (LLVMPointsToSetImpl *)
                   LLVMPointsToSet::begin((LLVMPointsToSet *)in_stack_fffffffffffffe88.offset);
        local_60 = (LLVMPointsToSetImpl *)LLVMPointsToSet::end();
        while( true ) {
          bVar2 = LLVMPointsToSet::const_iterator::operator!=
                            ((const_iterator *)in_stack_fffffffffffffe90,
                             (const_iterator *)in_stack_fffffffffffffe88.offset);
          if (!bVar2) break;
          auVar6 = LLVMPointsToSet::const_iterator::operator*((const_iterator *)0x19ee9d);
          local_68 = local_78;
          local_78 = auVar6;
          bVar2 = llvm::isa<llvm::Function,llvm::Value*>((Value **)0x19eeca);
          if (!bVar2) {
            local_80 = (LLVMReadWriteGraphBuilder *)
                       getOperand((LLVMReadWriteGraphBuilder *)in_stack_fffffffffffffec0.offset,
                                  (Value *)in_stack_fffffffffffffeb8.offset);
            Offset::Offset(&local_88,Offset::UNKNOWN);
            Offset::Offset(&local_90,Offset::UNKNOWN);
            local_98 = FunctionModel::defines(in_RDI,operand);
            if (local_98 != (Operand *)0x0) {
              local_a8 = getFromTo<dg::FunctionModel::Operand_const*>
                                   ((CallInst *)in_RDI,
                                    (Operand *)CONCAT44(operand,in_stack_fffffffffffffea8));
              std::tie<dg::Offset,dg::Offset>
                        ((Offset *)in_stack_fffffffffffffe98.offset,
                         (Offset *)in_stack_fffffffffffffe90);
              std::tuple<dg::Offset&,dg::Offset&>::operator=
                        ((tuple<dg::Offset_&,_dg::Offset_&> *)in_stack_fffffffffffffea0,
                         (pair<dg::Offset,_dg::Offset> *)in_stack_fffffffffffffe98.offset);
              sVar4 = LLVMPointsToSet::size((LLVMPointsToSet *)0x19efb3);
              in_stack_fffffffffffffea8 = in_stack_fffffffffffffea8 & 0xffffff;
              if (sVar4 == 1) {
                bVar2 = Offset::isUnknown((Offset *)(local_68 + 8));
                in_stack_fffffffffffffea8 = in_stack_fffffffffffffea8 & 0xffffff;
                if (!bVar2) {
                  local_d0 = local_88.offset;
                  local_c8 = Offset::operator+((Offset *)in_stack_fffffffffffffe90,
                                               in_stack_fffffffffffffe98);
                  bVar2 = Offset::isUnknown(&local_c8);
                  in_stack_fffffffffffffea8 = in_stack_fffffffffffffea8 & 0xffffff;
                  if (!bVar2) {
                    local_d8 = Offset::operator+((Offset *)in_stack_fffffffffffffe90,
                                                 in_stack_fffffffffffffe98);
                    bVar2 = Offset::isUnknown(&local_d8);
                    in_stack_fffffffffffffea8 = in_stack_fffffffffffffea8 & 0xffffff;
                    if (!bVar2) {
                      bVar2 = llvm::isa<llvm::CallInst,llvm::Value*>((Value **)0x19f08b);
                      in_stack_fffffffffffffea8 =
                           CONCAT13(bVar2,(int3)in_stack_fffffffffffffea8) ^ 0xff000000;
                    }
                  }
                }
              }
              local_b9 = (byte)(in_stack_fffffffffffffea8 >> 0x18) & 1;
              in_stack_fffffffffffffe98.offset = local_20.offset;
              in_stack_fffffffffffffea0 = local_80;
              Offset::operator+((Offset *)in_stack_fffffffffffffe90,local_20);
              Offset::operator+((Offset *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
              RWNode::addDef((RWNode *)in_stack_fffffffffffffec0.offset,
                             (RWNode *)in_stack_fffffffffffffeb8.offset,(Offset *)in_RDI,
                             (Offset *)CONCAT44(operand,in_stack_fffffffffffffea8),
                             SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
            }
            pOVar5 = FunctionModel::uses(in_RDI,operand);
            if (pOVar5 != (Operand *)0x0) {
              getFromTo<dg::FunctionModel::Operand_const*>
                        ((CallInst *)in_RDI,(Operand *)CONCAT44(operand,in_stack_fffffffffffffea8));
              std::tie<dg::Offset,dg::Offset>
                        ((Offset *)in_stack_fffffffffffffe98.offset,
                         (Offset *)in_stack_fffffffffffffe90);
              std::tuple<dg::Offset&,dg::Offset&>::operator=
                        ((tuple<dg::Offset_&,_dg::Offset_&> *)in_stack_fffffffffffffea0,
                         (pair<dg::Offset,_dg::Offset> *)in_stack_fffffffffffffe98.offset);
              in_stack_fffffffffffffe88.offset = local_20.offset;
              in_stack_fffffffffffffe90 = local_80;
              Offset::operator+((Offset *)local_80,in_stack_fffffffffffffe98);
              in_stack_fffffffffffffeb8.offset = local_90.offset;
              in_stack_fffffffffffffec0 =
                   Offset::operator+((Offset *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
              RWNode::addUse((RWNode *)in_stack_fffffffffffffec0.offset,
                             (RWNode *)in_stack_fffffffffffffeb8.offset,(Offset *)in_RDI,
                             (Offset *)CONCAT44(operand,in_stack_fffffffffffffea8));
            }
          }
          LLVMPointsToSet::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe90);
        }
        local_44 = 0;
      }
      std::pair<bool,_dg::LLVMPointsToSet>::~pair((pair<bool,_dg::LLVMPointsToSet> *)0x19f257);
    }
    local_24 = local_24 + 1;
  }
  return (RWNode *)local_20.offset;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::funcFromModel(const FunctionModel *model,
                                                 const llvm::CallInst *CInst) {
    RWNode *node = &create(RWNodeType::GENERIC);

    for (unsigned int i = 0; i < llvmutils::getNumArgOperands(CInst); ++i) {
        if (!model->handles(i))
            continue;

        auto *const llvmOp = CInst->getArgOperand(i);
        auto pts = PTA->getLLVMPointsToChecked(llvmOp);
        // if we do not have a pts, this is not pointer
        // relevant instruction. We must do it this way
        // instead of type checking, due to the inttoptr.
        if (!pts.first) {
            llvm::errs()
                    << "[Warning]: did not find pt-set for modeled function\n";
            llvm::errs() << "           Func: " << model->name << ", operand "
                         << i << "\n";
            continue;
        }

        for (const auto &ptr : pts.second) {
            if (llvm::isa<llvm::Function>(ptr.value))
                // functions may not be redefined
                continue;

            RWNode *target = getOperand(ptr.value);
            assert(target && "Don't have pointer target for call argument");

            Offset from, to;
            if (const auto *defines = model->defines(i)) {
                std::tie(from, to) = getFromTo(CInst, defines);
                // this call may define this memory
                bool strong_updt = pts.second.size() == 1 &&
                                   !ptr.offset.isUnknown() &&
                                   !(ptr.offset + from).isUnknown() &&
                                   !(ptr.offset + to).isUnknown() &&
                                   !llvm::isa<llvm::CallInst>(ptr.value);
                // FIXME: what about vars in recursive functions?
                node->addDef(target, ptr.offset + from, ptr.offset + to,
                             strong_updt);
            }
            if (const auto *uses = model->uses(i)) {
                std::tie(from, to) = getFromTo(CInst, uses);
                // this call uses this memory
                node->addUse(target, ptr.offset + from, ptr.offset + to);
            }
        }
    }

    return node;
}